

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

longlong __thiscall mkvparser::Segment::ParseHeaders(Segment *this)

{
  int iVar1;
  longlong lVar2;
  longlong lVar3;
  Tags *this_00;
  SegmentInfo *this_01;
  Chapters *this_02;
  Cues *pCVar4;
  SeekHead *this_03;
  Tracks *this_04;
  ulong uVar5;
  ulong pos;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long len;
  longlong available;
  longlong total;
  long local_48;
  long local_40;
  ulong local_38;
  
  iVar1 = (*this->m_pReader->_vptr_IMkvReader[1])(this->m_pReader,&local_38,&local_40);
  if (iVar1 < 0) {
    lVar9 = (long)iVar1;
  }
  else {
    lVar9 = -2;
    if (((long)local_38 < 1) || (local_40 <= (long)local_38)) {
      uVar6 = 0xffffffffffffffff;
      if (-1 < this->m_size) {
        uVar6 = this->m_start + this->m_size;
      }
      if (((long)uVar6 <= (long)local_38 || (long)(uVar6 | local_38) < 0) &&
         (uVar5 = this->m_pos, (long)uVar6 < 0 || (long)uVar5 <= (long)uVar6)) {
        if (((long)local_38 < 0 || (long)uVar5 < (long)local_38) &&
           (pos = uVar5, (long)uVar6 < 0 || (long)uVar5 < (long)uVar6)) {
          while( true ) {
            lVar7 = pos + 1;
            if (lVar7 < 0) {
              return -2;
            }
            if (local_40 < lVar7) {
              return lVar7;
            }
            lVar2 = GetUIntLength(this->m_pReader,pos,&local_48);
            if (lVar2 < 0) {
              return lVar2;
            }
            if (lVar2 != 0) {
              return lVar7;
            }
            lVar7 = local_48 + pos;
            if ((-1 < (long)uVar6) && ((long)uVar6 < lVar7)) {
              return -2;
            }
            if (local_40 < lVar7) {
              return lVar7;
            }
            lVar2 = ReadID(this->m_pReader,pos,&local_48);
            if (lVar2 < 0) {
              return -2;
            }
            if (lVar2 == 0x1f43b675) break;
            lVar7 = local_48 + pos;
            if (local_40 <= lVar7) {
LAB_0010ff2b:
              return lVar7 + 1;
            }
            lVar3 = GetUIntLength(this->m_pReader,lVar7,&local_48);
            if (lVar3 < 0) {
              return lVar3;
            }
            if (lVar3 != 0) goto LAB_0010ff2b;
            lVar8 = local_48 + lVar7;
            if ((-1 < (long)uVar6) && ((long)uVar6 < lVar8)) {
              return -2;
            }
            if (local_40 < lVar8) {
              return lVar8;
            }
            lVar3 = ReadUInt(this->m_pReader,lVar7,&local_48);
            if (lVar3 < 0) {
              return lVar3;
            }
            if (local_48 - 9U < 0xfffffffffffffff8) {
              return lVar3;
            }
            lVar7 = local_48 + lVar7;
            uVar5 = lVar3 + lVar7;
            if ((long)uVar5 < 0) {
              return -2;
            }
            if (uVar6 < uVar5) {
              return -2;
            }
            if (local_40 < (long)uVar5) {
              return uVar5;
            }
            lVar8 = uVar5 - pos;
            if (lVar2 < 0x1549a966) {
              if (lVar2 == 0x1043a770) {
                if (this->m_pChapters == (Chapters *)0x0) {
                  this_02 = (Chapters *)operator_new(0x38,(nothrow_t *)&std::nothrow);
                  if (this_02 == (Chapters *)0x0) {
                    this->m_pChapters = (Chapters *)0x0;
                    return -1;
                  }
                  this_02->m_pSegment = this;
                  this_02->m_start = lVar7;
                  this_02->m_size = lVar3;
                  this_02->m_element_start = pos;
                  this_02->m_element_size = lVar8;
                  this_02->m_editions = (Edition *)0x0;
                  this_02->m_editions_size = 0;
                  this_02->m_editions_count = 0;
                  this->m_pChapters = this_02;
                  lVar7 = Chapters::Parse(this_02);
                  goto LAB_0010feb6;
                }
              }
              else if (lVar2 == 0x114d9b74) {
                if (this->m_pSeekHead == (SeekHead *)0x0) {
                  this_03 = (SeekHead *)operator_new(0x48,(nothrow_t *)&std::nothrow);
                  if (this_03 == (SeekHead *)0x0) {
                    this->m_pSeekHead = (SeekHead *)0x0;
                    return -1;
                  }
                  this_03->m_pSegment = this;
                  this_03->m_start = lVar7;
                  this_03->m_size = lVar3;
                  this_03->m_element_start = pos;
                  this_03->m_element_size = lVar8;
                  this_03->m_entries = (Entry *)0x0;
                  this_03->m_entry_count = 0;
                  this_03->m_void_elements = (VoidElement *)0x0;
                  this_03->m_void_element_count = 0;
                  this->m_pSeekHead = this_03;
                  lVar7 = SeekHead::Parse(this_03);
                  goto LAB_0010feb6;
                }
              }
              else if ((lVar2 == 0x1254c367) && (this->m_pTags == (Tags *)0x0)) {
                this_00 = (Tags *)operator_new(0x38,(nothrow_t *)&std::nothrow);
                if (this_00 == (Tags *)0x0) {
                  this->m_pTags = (Tags *)0x0;
                  return -1;
                }
                this_00->m_pSegment = this;
                this_00->m_start = lVar7;
                this_00->m_size = lVar3;
                this_00->m_element_start = pos;
                this_00->m_element_size = lVar8;
                this_00->m_tags = (Tag *)0x0;
                this_00->m_tags_size = 0;
                this_00->m_tags_count = 0;
                this->m_pTags = this_00;
                lVar7 = Tags::Parse(this_00);
                goto LAB_0010feb6;
              }
            }
            else if (lVar2 == 0x1c53bb6b) {
              if (this->m_pCues == (Cues *)0x0) {
                pCVar4 = (Cues *)operator_new(0x48,(nothrow_t *)&std::nothrow);
                if (pCVar4 == (Cues *)0x0) {
                  this->m_pCues = (Cues *)0x0;
                  return -1;
                }
                pCVar4->m_pSegment = this;
                pCVar4->m_start = lVar7;
                pCVar4->m_size = lVar3;
                pCVar4->m_element_start = pos;
                pCVar4->m_element_size = lVar8;
                pCVar4->m_cue_points = (CuePoint **)0x0;
                pCVar4->m_count = 0;
                pCVar4->m_preload_count = 0;
                pCVar4->m_pos = lVar7;
                this->m_pCues = pCVar4;
              }
            }
            else {
              if (lVar2 == 0x1654ae6b) {
                if (this->m_pTracks != (Tracks *)0x0) {
                  return -2;
                }
                this_04 = (Tracks *)operator_new(0x38,(nothrow_t *)&std::nothrow);
                if (this_04 == (Tracks *)0x0) {
                  this->m_pTracks = (Tracks *)0x0;
                  return -1;
                }
                this_04->m_pSegment = this;
                this_04->m_start = lVar7;
                this_04->m_size = lVar3;
                this_04->m_element_start = pos;
                this_04->m_element_size = lVar8;
                this_04->m_trackEntries = (Track **)0x0;
                this_04->m_trackEntriesEnd = (Track **)0x0;
                this->m_pTracks = this_04;
                lVar7 = Tracks::Parse(this_04);
              }
              else {
                if (lVar2 != 0x1549a966) goto LAB_0010febb;
                if (this->m_pInfo != (SegmentInfo *)0x0) {
                  return -2;
                }
                this_01 = (SegmentInfo *)operator_new(0x50,(nothrow_t *)&std::nothrow);
                if (this_01 == (SegmentInfo *)0x0) {
                  this->m_pInfo = (SegmentInfo *)0x0;
                  return -1;
                }
                this_01->m_pSegment = this;
                this_01->m_start = lVar7;
                this_01->m_size = lVar3;
                this_01->m_element_start = pos;
                this_01->m_element_size = lVar8;
                this_01->m_pMuxingAppAsUTF8 = (char *)0x0;
                this_01->m_pWritingAppAsUTF8 = (char *)0x0;
                this_01->m_pTitleAsUTF8 = (char *)0x0;
                this->m_pInfo = this_01;
                lVar7 = SegmentInfo::Parse(this_01);
              }
LAB_0010feb6:
              if (lVar7 != 0) {
                return lVar7;
              }
            }
LAB_0010febb:
            this->m_pos = uVar5;
            if ((local_38 <= uVar5) || (pos = uVar5, uVar6 <= uVar5)) goto LAB_0010feec;
          }
          uVar5 = this->m_pos;
        }
LAB_0010feec:
        if (((long)uVar6 < 0 || (long)uVar5 <= (long)uVar6) && (this->m_pInfo != (SegmentInfo *)0x0)
           ) {
          lVar9 = (ulong)(this->m_pTracks != (Tracks *)0x0) * 2 + -2;
        }
      }
    }
  }
  return lVar9;
}

Assistant:

long long Segment::ParseHeaders() {
  // Outermost (level 0) segment object has been constructed,
  // and pos designates start of payload.  We need to find the
  // inner (level 1) elements.
  long long total, available;

  const int status = m_pReader->Length(&total, &available);

  if (status < 0)  // error
    return status;

  if (total > 0 && available > total)
    return E_FILE_FORMAT_INVALID;

  const long long segment_stop = (m_size < 0) ? -1 : m_start + m_size;

  if ((segment_stop >= 0 && total >= 0 && segment_stop > total) ||
      (segment_stop >= 0 && m_pos > segment_stop)) {
    return E_FILE_FORMAT_INVALID;
  }

  for (;;) {
    if ((total >= 0) && (m_pos >= total))
      break;

    if ((segment_stop >= 0) && (m_pos >= segment_stop))
      break;

    long long pos = m_pos;
    const long long element_start = pos;

    // Avoid rolling over pos when very close to LLONG_MAX.
    unsigned long long rollover_check = pos + 1ULL;
    if (rollover_check > LLONG_MAX)
      return E_FILE_FORMAT_INVALID;

    if ((pos + 1) > available)
      return (pos + 1);

    long len;
    long long result = GetUIntLength(m_pReader, pos, len);

    if (result < 0)  // error
      return result;

    if (result > 0) {
      // MkvReader doesn't have enough data to satisfy this read attempt.
      return (pos + 1);
    }

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > available)
      return pos + len;

    const long long idpos = pos;
    const long long id = ReadID(m_pReader, idpos, len);

    if (id < 0)
      return E_FILE_FORMAT_INVALID;

    if (id == libwebm::kMkvCluster)
      break;

    pos += len;  // consume ID

    if ((pos + 1) > available)
      return (pos + 1);

    // Read Size
    result = GetUIntLength(m_pReader, pos, len);

    if (result < 0)  // error
      return result;

    if (result > 0) {
      // MkvReader doesn't have enough data to satisfy this read attempt.
      return (pos + 1);
    }

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > available)
      return pos + len;

    const long long size = ReadUInt(m_pReader, pos, len);

    if (size < 0 || len < 1 || len > 8) {
      // TODO(tomfinegan): ReadUInt should return an error when len is < 1 or
      // len > 8 is true instead of checking this _everywhere_.
      return size;
    }

    pos += len;  // consume length of size of element

    // Avoid rolling over pos when very close to LLONG_MAX.
    rollover_check = static_cast<unsigned long long>(pos) + size;
    if (rollover_check > LLONG_MAX)
      return E_FILE_FORMAT_INVALID;

    const long long element_size = size + pos - element_start;

    // Pos now points to start of payload

    if ((segment_stop >= 0) && ((pos + size) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    // We read EBML elements either in total or nothing at all.

    if ((pos + size) > available)
      return pos + size;

    if (id == libwebm::kMkvInfo) {
      if (m_pInfo)
        return E_FILE_FORMAT_INVALID;

      m_pInfo = new (std::nothrow)
          SegmentInfo(this, pos, size, element_start, element_size);

      if (m_pInfo == NULL)
        return -1;

      const long status = m_pInfo->Parse();

      if (status)
        return status;
    } else if (id == libwebm::kMkvTracks) {
      if (m_pTracks)
        return E_FILE_FORMAT_INVALID;

      m_pTracks = new (std::nothrow)
          Tracks(this, pos, size, element_start, element_size);

      if (m_pTracks == NULL)
        return -1;

      const long status = m_pTracks->Parse();

      if (status)
        return status;
    } else if (id == libwebm::kMkvCues) {
      if (m_pCues == NULL) {
        m_pCues = new (std::nothrow)
            Cues(this, pos, size, element_start, element_size);

        if (m_pCues == NULL)
          return -1;
      }
    } else if (id == libwebm::kMkvSeekHead) {
      if (m_pSeekHead == NULL) {
        m_pSeekHead = new (std::nothrow)
            SeekHead(this, pos, size, element_start, element_size);

        if (m_pSeekHead == NULL)
          return -1;

        const long status = m_pSeekHead->Parse();

        if (status)
          return status;
      }
    } else if (id == libwebm::kMkvChapters) {
      if (m_pChapters == NULL) {
        m_pChapters = new (std::nothrow)
            Chapters(this, pos, size, element_start, element_size);

        if (m_pChapters == NULL)
          return -1;

        const long status = m_pChapters->Parse();

        if (status)
          return status;
      }
    } else if (id == libwebm::kMkvTags) {
      if (m_pTags == NULL) {
        m_pTags = new (std::nothrow)
            Tags(this, pos, size, element_start, element_size);

        if (m_pTags == NULL)
          return -1;

        const long status = m_pTags->Parse();

        if (status)
          return status;
      }
    }

    m_pos = pos + size;  // consume payload
  }

  if (segment_stop >= 0 && m_pos > segment_stop)
    return E_FILE_FORMAT_INVALID;

  if (m_pInfo == NULL)  // TODO: liberalize this behavior
    return E_FILE_FORMAT_INVALID;

  if (m_pTracks == NULL)
    return E_FILE_FORMAT_INVALID;

  return 0;  // success
}